

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Finder *pFVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  Descriptor *pDVar8;
  FieldDescriptor *field;
  FieldDescriptor *pFVar9;
  long *plVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar11;
  LogMessage *other;
  size_type *psVar12;
  ulong *puVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  char *__end;
  string part;
  string field_name;
  undefined1 local_110 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  Reflection *local_58;
  Message *local_50;
  Descriptor *local_48;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_00;
  
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  local_58 = (Reflection *)CONCAT44(extraout_var,iVar7);
  local_50 = message;
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  pDVar8 = (Descriptor *)CONCAT44(extraout_var_00,iVar7);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_40 = (ulong)(uint)(this->tokenizer_).current_.line;
  local_38 = (ulong)(uint)(this->tokenizer_).current_.column;
  local_110._0_8_ = local_110 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"[","");
  bVar5 = TryConsume(this,(string *)local_110);
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if (bVar5) {
    bVar5 = ConsumeIdentifier(this,&local_78);
    if (bVar5) {
      local_48 = pDVar8;
      do {
        local_110._0_8_ = local_110 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,".","");
        bVar5 = TryConsume(this,(string *)local_110);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        if (!bVar5) {
          local_110._0_8_ = local_110 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"]","");
          bVar5 = Consume(this,(string *)local_110);
          pDVar8 = local_48;
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          if (bVar5) {
            pFVar2 = this->finder_;
            if (pFVar2 == (Finder *)0x0) {
              iVar7 = (*local_58->_vptr_Reflection[0x42])(local_58,&local_78);
              field = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar7);
            }
            else {
              iVar7 = (*pFVar2->_vptr_Finder[2])(pFVar2,local_50,&local_78);
              field = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar7);
            }
            if (field != (FieldDescriptor *)0x0) goto LAB_001b55cb;
            if (this->allow_unknown_field_ != false) {
              std::operator+(&local_98,"Extension \"",&local_78);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              psVar12 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_b8.field_2._M_allocated_capacity = *psVar12;
                local_b8.field_2._8_8_ = puVar11[3];
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar12;
                local_b8._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_b8._M_string_length = puVar11[1];
              *puVar11 = psVar12;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::operator+(&local_d8,&local_b8,
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (pDVar8 + 8));
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
              local_110._0_8_ = local_110 + 0x10;
              puVar13 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_110._16_8_ = *puVar13;
                local_110._24_8_ = puVar11[3];
              }
              else {
                local_110._16_8_ = *puVar13;
                local_110._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar11;
              }
              local_110._8_8_ = puVar11[1];
              *puVar11 = puVar13;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column
                            ,(string *)local_110);
              if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
                operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_001b54ca;
              goto LAB_001b54bd;
            }
            std::operator+(&local_98,"Extension \"",&local_78);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            psVar12 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_b8.field_2._M_allocated_capacity = *psVar12;
              local_b8.field_2._8_8_ = puVar11[3];
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar12;
              local_b8._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_b8._M_string_length = puVar11[1];
            *puVar11 = psVar12;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::operator+(&local_d8,&local_b8,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (pDVar8 + 8));
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
            local_110._0_8_ = local_110 + 0x10;
            puVar13 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_110._16_8_ = *puVar13;
              local_110._24_8_ = puVar11[3];
            }
            else {
              local_110._16_8_ = *puVar13;
              local_110._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_110._8_8_ = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_110);
            if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
              operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_001b556d;
            goto LAB_001b5560;
          }
          break;
        }
        local_110._0_8_ = local_110 + 0x10;
        local_110._8_8_ = (char *)0x0;
        local_110._16_8_ = local_110._16_8_ & 0xffffffffffffff00;
        bVar5 = ConsumeIdentifier(this,(string *)local_110);
        if (!bVar5) {
          local_98.field_2._M_allocated_capacity = local_110._16_8_;
          _Var15._M_p = (pointer)local_110._0_8_;
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) goto LAB_001b5d01;
          break;
        }
        std::__cxx11::string::append((char *)&local_78);
        std::__cxx11::string::_M_append((char *)&local_78,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
      } while (bVar5);
    }
  }
  else {
    bVar5 = ConsumeIdentifier(this,&local_78);
    if (bVar5) {
      field = Descriptor::FindFieldByName(pDVar8,&local_78);
      if (field == (FieldDescriptor *)0x0) {
        local_110._0_8_ = local_110 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + local_78._M_string_length);
        if ((char *)local_110._8_8_ != (char *)0x0) {
          pcVar14 = (char *)0x0;
          do {
            if ((byte)(*(byte *)(local_110._0_8_ + (long)pcVar14) + 0xbf) < 0x1a) {
              *(byte *)(local_110._0_8_ + (long)pcVar14) =
                   *(byte *)(local_110._0_8_ + (long)pcVar14) | 0x20;
            }
            pcVar14 = pcVar14 + 1;
          } while ((char *)local_110._8_8_ != pcVar14);
        }
        pFVar9 = Descriptor::FindFieldByName(pDVar8,(string *)local_110);
        field = (FieldDescriptor *)0x0;
        if ((pFVar9 != (FieldDescriptor *)0x0) && (*(int *)(pFVar9 + 0x2c) == 10)) {
          field = pFVar9;
        }
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
      }
      if (field == (FieldDescriptor *)0x0) {
LAB_001b518d:
        field = (FieldDescriptor *)0x0;
      }
      else if (*(int *)(field + 0x2c) == 10) {
        sVar3 = ((undefined8 *)**(long **)(field + 0x48))[1];
        if (sVar3 != local_78._M_string_length) goto LAB_001b518d;
        if (sVar3 != 0) {
          iVar7 = bcmp(*(void **)**(long **)(field + 0x48),local_78._M_dataplus._M_p,sVar3);
          if (iVar7 != 0) {
            field = (FieldDescriptor *)0x0;
          }
        }
      }
      if (field == (FieldDescriptor *)0x0) {
        if (this->allow_unknown_field_ != false) {
          std::operator+(&local_98,"Message type \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (pDVar8 + 8));
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_b8.field_2._M_allocated_capacity = *psVar12;
            local_b8.field_2._8_8_ = plVar10[3];
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar12;
            local_b8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_b8._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
          puVar13 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_d8.field_2._M_allocated_capacity = *puVar13;
            local_d8.field_2._8_8_ = plVar10[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *puVar13;
            local_d8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_d8._M_string_length = plVar10[1];
          *plVar10 = (long)puVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
          local_110._0_8_ = local_110 + 0x10;
          puVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_110._16_8_ = *puVar13;
            local_110._24_8_ = puVar11[3];
          }
          else {
            local_110._16_8_ = *puVar13;
            local_110._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_110._8_8_ = puVar11[1];
          *puVar11 = puVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_110);
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_001b54bd:
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
LAB_001b54ca:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          field = (FieldDescriptor *)0x0;
          goto LAB_001b55cb;
        }
        std::operator+(&local_98,"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pDVar8 + 8));
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar12 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_b8.field_2._M_allocated_capacity = *psVar12;
          local_b8.field_2._8_8_ = puVar11[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar12;
          local_b8._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_b8._M_string_length = puVar11[1];
        *puVar11 = psVar12;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_d8.field_2._M_allocated_capacity = *puVar13;
          local_d8.field_2._8_8_ = puVar11[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *puVar13;
          local_d8._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_d8._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        local_110._0_8_ = local_110 + 0x10;
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_110._16_8_ = *puVar13;
          local_110._24_8_ = puVar11[3];
        }
        else {
          local_110._16_8_ = *puVar13;
          local_110._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_110._8_8_ = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_110);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_001b5560:
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
LAB_001b556d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        _Var15._M_p = local_98._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_001b5d09;
LAB_001b5d01:
        operator_delete(_Var15._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      else {
LAB_001b55cb:
        if (field == (FieldDescriptor *)0x0) {
          if (this->allow_unknown_field_ == false) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_110,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/text_format.cc"
                       ,0x17e);
            other = internal::LogMessage::operator<<
                              ((LogMessage *)local_110,"CHECK failed: allow_unknown_field_: ");
            internal::LogFinisher::operator=((LogFinisher *)&local_d8,other);
            internal::LogMessage::~LogMessage((LogMessage *)local_110);
          }
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,":","");
          bVar5 = TryConsume(this,&local_d8);
          if (bVar5) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{","");
            sVar3 = (this->tokenizer_).current_.text._M_string_length;
            if ((sVar3 == local_b8._M_string_length) &&
               ((sVar3 == 0 ||
                (iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                              local_b8._M_dataplus._M_p,sVar3), iVar7 == 0)))) goto LAB_001b59a4;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"<","");
            sVar3 = (this->tokenizer_).current_.text._M_string_length;
            bVar4 = true;
            if (sVar3 == local_98._M_string_length) {
              bVar6 = true;
              if (sVar3 != 0) {
                iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                             local_98._M_dataplus._M_p,sVar3);
                bVar6 = iVar7 != 0;
                goto LAB_001b59aa;
              }
              goto LAB_001b59a7;
            }
            bVar6 = true;
          }
          else {
LAB_001b59a4:
            bVar6 = false;
LAB_001b59a7:
            bVar4 = bVar6;
            bVar6 = false;
          }
LAB_001b59aa:
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2)) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((bVar5) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (bVar6) {
            bVar5 = SkipFieldValue(this);
          }
          else {
            bVar5 = SkipFieldMessage(this);
          }
          goto LAB_001b5d0b;
        }
        if (((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
            (*(int *)(field + 0x30) != 3)) &&
           (iVar7 = (*local_58->_vptr_Reflection[5])(local_58,local_50,field), (char)iVar7 != '\0'))
        {
          std::operator+(&local_d8,"Non-repeated field \"",&local_78);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
          local_110._0_8_ = local_110 + 0x10;
          puVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_110._16_8_ = *puVar13;
            local_110._24_8_ = puVar11[3];
          }
          else {
            local_110._16_8_ = *puVar13;
            local_110._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_110._8_8_ = puVar11[1];
          *puVar11 = puVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_110);
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          local_98.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
          _Var15._M_p = local_d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_001b5d01;
        }
        else {
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) ==
              10) {
            local_110._0_8_ = local_110 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,":","");
            TryConsume(this,(string *)local_110);
            if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
              operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
            }
            bVar5 = ConsumeFieldMessage(this,local_50,local_58,field);
          }
          else {
            local_110._0_8_ = local_110 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,":","");
            bVar5 = Consume(this,(string *)local_110);
            if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
              operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
            }
            if (!bVar5) goto LAB_001b5d09;
            if (*(int *)(field + 0x30) == 3) {
              local_110._0_8_ = local_110 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"[","");
              bVar5 = TryConsume(this,(string *)local_110);
              if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
                operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
              }
            }
            else {
              bVar5 = false;
            }
            if (bVar5 != false) {
              paVar1 = &local_d8.field_2;
              do {
                bVar5 = ConsumeFieldValue(this,local_50,local_58,field);
                if (!bVar5) goto LAB_001b5d09;
                local_d8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"]","");
                bVar5 = TryConsume(this,&local_d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                if (bVar5) goto LAB_001b56db;
                local_d8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,",","");
                bVar6 = Consume(this,&local_d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                bVar5 = false;
              } while (bVar6);
              goto LAB_001b5d0b;
            }
            bVar5 = ConsumeFieldValue(this,local_50,local_58,field);
          }
          if (bVar5 != false) {
LAB_001b56db:
            paVar1 = &local_d8.field_2;
            local_d8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,";","");
            bVar5 = TryConsume(this,&local_d8);
            if (!bVar5) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,",","");
              TryConsume(this,&local_b8);
              if ((!bVar5) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != paVar1) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if (*(char *)(*(long *)(field + 0x60) + 0x46) == '\x01') {
              std::operator+(&local_98,"text format contains deprecated field \"",&local_78);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
              puVar13 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_d8.field_2._M_allocated_capacity = *puVar13;
                local_d8.field_2._8_8_ = puVar11[3];
                local_d8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_d8.field_2._M_allocated_capacity = *puVar13;
                local_d8._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_d8._M_string_length = puVar11[1];
              *puVar11 = puVar13;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column
                            ,&local_d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != paVar1) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
            }
            bVar5 = true;
            if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
              ParseInfoTree::RecordLocation
                        (this->parse_info_tree_,field,(ParseLocation)((local_38 << 0x20) + local_40)
                        );
            }
            goto LAB_001b5d0b;
          }
        }
      }
    }
  }
LAB_001b5d09:
  bVar5 = false;
LAB_001b5d0b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    string field_name;

    const FieldDescriptor* field = NULL;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeIdentifier(&field_name));
      while (TryConsume(".")) {
        string part;
        DO(ConsumeIdentifier(&part));
        field_name += ".";
        field_name += part;
      }
      DO(Consume("]"));

      field = (finder_ != NULL
               ? finder_->FindExtension(message, field_name)
               : reflection->FindKnownExtensionByName(field_name));

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Extension \"" + field_name + "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Extension \"" + field_name + "\" is not defined or "
                        "is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      field = descriptor->FindFieldByName(field_name);
      // Group names are expected to be capitalized as they appear in the
      // .proto file, which actually matches their type names, not their field
      // names.
      if (field == NULL) {
        string lower_field_name = field_name;
        LowerString(&lower_field_name);
        field = descriptor->FindFieldByName(lower_field_name);
        // If the case-insensitive match worked but the field is NOT a group,
        if (field != NULL && field->type() != FieldDescriptor::TYPE_GROUP) {
          field = NULL;
        }
      }
      // Again, special-case group names as described above.
      if (field != NULL && field->type() == FieldDescriptor::TYPE_GROUP
          && field->message_type()->name() != field_name) {
        field = NULL;
      }

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown field.
    if (field == NULL) {
      GOOGLE_CHECK(allow_unknown_field_);
      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the begining of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    // Fail if the field is not repeated and it has already been specified.
    if ((singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
        !field->is_repeated() && reflection->HasField(*message, field)) {
      ReportError("Non-repeated field \"" + field_name +
                  "\" is specified multiple times.");
      return false;
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      TryConsume(":");
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(Consume(":"));
      if (field->is_repeated() && TryConsume("[")) {
        // Short repeated format, e.g.  "foo: [1, 2, 3]"
        while (true) {
          DO(ConsumeFieldValue(message, reflection, field));
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      } else {
        DO(ConsumeFieldValue(message, reflection, field));
      }
    }

    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \""
                    + field_name + "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != NULL) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }